

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateActivation
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  ActivationParams *pAVar2;
  allocator local_d9;
  undefined1 local_d8 [40];
  string local_b0;
  Result r;
  string local_68;
  string local_48;
  
  Result::Result(&r);
  validateInputCount((Result *)local_d8,layer,1,1);
  Result::operator=(&r,(Result *)local_d8);
  std::__cxx11::string::~string((string *)(local_d8 + 8));
  bVar1 = Result::good(&r);
  if (bVar1) {
    validateOutputCount((Result *)local_d8,layer,1,1);
    Result::operator=(&r,(Result *)local_d8);
    std::__cxx11::string::~string((string *)(local_d8 + 8));
  }
  bVar1 = Result::good(&r);
  if (!bVar1) goto LAB_002469c5;
  if (this->ndArrayInterpretation == true) {
    pAVar2 = Specification::NeuralNetworkLayer::activation(layer);
    if (pAVar2->_oneof_case_[0] == 0x19) {
      std::__cxx11::string::string((string *)&local_48,"ActivationPReLU",(allocator *)&local_b0);
      validateInputOutputRankEquality((Result *)local_d8,layer,&local_48,&this->blobNameToRank);
      Result::operator=(&r,(Result *)local_d8);
      std::__cxx11::string::~string((string *)(local_d8 + 8));
      std::__cxx11::string::~string((string *)&local_48);
      bVar1 = Result::good(&r);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_b0,"ActivationPReLU",&local_d9);
        validateRankCount((Result *)local_d8,layer,&local_b0,3,-1,&this->blobNameToRank);
        Result::operator=(&r,(Result *)local_d8);
        std::__cxx11::string::~string((string *)(local_d8 + 8));
        std::__cxx11::string::~string((string *)&local_b0);
        bVar1 = Result::good(&r);
        if (bVar1) goto LAB_002468d0;
      }
    }
    else {
LAB_002468d0:
      pAVar2 = Specification::NeuralNetworkLayer::activation(layer);
      if (pAVar2->_oneof_case_[0] != 0x47) goto LAB_002469b0;
      std::__cxx11::string::string
                ((string *)&local_68,"ActivationParametricSoftplus",(allocator *)&local_b0);
      validateInputOutputRankEquality((Result *)local_d8,layer,&local_68,&this->blobNameToRank);
      Result::operator=(&r,(Result *)local_d8);
      std::__cxx11::string::~string((string *)(local_d8 + 8));
      std::__cxx11::string::~string((string *)&local_68);
      bVar1 = Result::good(&r);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_b0,"ActivationParametricSoftplus",&local_d9);
        validateRankCount((Result *)local_d8,layer,&local_b0,3,-1,&this->blobNameToRank);
        Result::operator=(&r,(Result *)local_d8);
        std::__cxx11::string::~string((string *)(local_d8 + 8));
        std::__cxx11::string::~string((string *)&local_b0);
        bVar1 = Result::good(&r);
        if (bVar1) goto LAB_002469b0;
      }
    }
LAB_002469c5:
    Result::Result(__return_storage_ptr__,&r);
  }
  else {
LAB_002469b0:
    pAVar2 = Specification::NeuralNetworkLayer::activation(layer);
    validateActivationParams(__return_storage_ptr__,pAVar2);
  }
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateActivation(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()) {return r;}
    if (ndArrayInterpretation) {
        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kPReLU) {
            r = validateInputOutputRankEquality(layer, "ActivationPReLU", blobNameToRank);
            if (!r.good()) {return r;}
            r = validateRankCount(layer, "ActivationPReLU", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }
        if (layer.activation().NonlinearityType_case() == Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus) {
            r = validateInputOutputRankEquality(layer, "ActivationParametricSoftplus", blobNameToRank);
            if (!r.good()) {return r;}
            r = validateRankCount(layer, "ActivationParametricSoftplus", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }
    }

    return validateActivationParams(layer.activation());
}